

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.c
# Opt level: O0

char * dictionary_get(dictionary *d,char *key,char *def)

{
  uint uVar1;
  int iVar2;
  long local_38;
  ssize_t i;
  uint hash;
  char *def_local;
  char *key_local;
  dictionary *d_local;
  
  uVar1 = dictionary_hash(key);
  local_38 = 0;
  while( true ) {
    if (d->size <= local_38) {
      return def;
    }
    if (((d->key[local_38] != (char *)0x0) && (uVar1 == d->hash[local_38])) &&
       (iVar2 = strcmp(key,d->key[local_38]), iVar2 == 0)) break;
    local_38 = local_38 + 1;
  }
  return d->val[local_38];
}

Assistant:

const char * dictionary_get(const dictionary * d, const char * key, const char * def)
{
    unsigned    hash ;
    ssize_t      i ;

    hash = dictionary_hash(key);
    for (i=0 ; i<d->size ; i++) {
        if (d->key[i]==NULL)
            continue ;
        /* Compare hash */
        if (hash==d->hash[i]) {
            /* Compare string, to avoid hash collisions */
            if (!strcmp(key, d->key[i])) {
                return d->val[i] ;
            }
        }
    }
    return def ;
}